

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

Maybe<capnp::InterfaceSchema::Method> * __thiscall
capnp::InterfaceSchema::findMethodByName
          (Maybe<capnp::InterfaceSchema::Method> *__return_storage_ptr__,InterfaceSchema *this,
          StringPtr name,uint *counter)

{
  anon_union_64_1_a8c68091_for_NullableValue<capnp::InterfaceSchema::Method>_2 *paVar1;
  ushort uVar2;
  RawSchema *pRVar3;
  bool bVar4;
  NullableValue<capnp::InterfaceSchema::Method> *pNVar5;
  Fault FVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong __n;
  ulong __n_00;
  uint64_t id;
  uint uVar12;
  unsigned_long i;
  long lVar13;
  bool bVar14;
  Reader RVar15;
  DebugComparison<unsigned_int,_const_unsigned_int_&> _kjCondition;
  int iStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  short sStack_c4;
  undefined2 uStack_c2;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined8 uStack_b8;
  Schema local_a8;
  Schema local_a0;
  Reader superclass;
  Fault f;
  ListReader LStack_60;
  
  uVar11 = name.content.size_;
  uVar10 = *counter;
  *counter = uVar10 + 1;
  _kjCondition.left = uVar10;
  _kjCondition.right = &MAX_SUPERCLASSES;
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = uVar10 < 0x40;
  if (uVar10 < 0x40) {
    pRVar3 = ((this->super_Schema).raw)->generic;
    getMethods((MethodList *)&f,this);
    uVar10 = pRVar3->memberCount;
    paVar1 = &(__return_storage_ptr__->ptr).field_1;
    uVar8 = 0;
    do {
      FVar6.exception = f.exception;
      if (uVar10 <= uVar8) {
        (__return_storage_ptr__->ptr).isSet = false;
        break;
      }
      uVar2 = *(ushort *)((long)pRVar3->membersByName + (ulong)(uVar8 + uVar10 & 0xfffffffe));
      capnp::_::ListReader::getStructElement
                ((StructReader *)&_kjCondition.op,&LStack_60,(uint)uVar2);
      _kjCondition._0_8_ = FVar6.exception;
      _kjCondition.right = (uint *)CONCAT62(_kjCondition.right._2_6_,uVar2);
      if (sStack_c4 == 0) {
        superclass._reader.pointers._0_4_ = 0x7fffffff;
        superclass._reader.capTable = (CapTableReader *)0x0;
        superclass._reader.data = (void *)0x0;
        superclass._reader.segment = (SegmentReader *)0x0;
      }
      else {
        superclass._reader.data = (void *)CONCAT44(uStack_cc,iStack_d0);
        superclass._reader.capTable = (CapTableReader *)_kjCondition.op.content.size_;
        superclass._reader.segment = (SegmentReader *)_kjCondition.op.content.ptr;
        superclass._reader.pointers._0_4_ = uStack_c0;
      }
      bVar14 = false;
      RVar15 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&superclass,(void *)0x0,0);
      __n = RVar15.super_StringPtr.content.size_;
      if (__n == uVar11) {
        if (__n == 0) {
          bVar14 = true;
        }
        else {
          iVar9 = bcmp(RVar15.super_StringPtr.content.ptr,name.content.ptr,__n);
          bVar14 = iVar9 == 0;
        }
      }
      if (bVar14) {
        (__return_storage_ptr__->ptr).isSet = true;
        pNVar5 = &__return_storage_ptr__->ptr;
        *(undefined4 *)((long)&pNVar5->field_1 + 0x30) = local_c8;
        *(short *)((long)&pNVar5->field_1 + 0x34) = sStack_c4;
        *(undefined2 *)((long)&pNVar5->field_1 + 0x36) = uStack_c2;
        *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.proto._reader.nestingLimit =
             CONCAT44(uStack_bc,uStack_c0);
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.data =
             (void *)CONCAT26(_kjCondition._38_2_,CONCAT24(_kjCondition._36_2_,_kjCondition._32_4_))
        ;
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.pointers =
             (WirePointer *)CONCAT44(uStack_cc,iStack_d0);
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.segment =
             (SegmentReader *)_kjCondition.op.content.ptr;
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.capTable =
             (CapTableReader *)_kjCondition.op.content.size_;
        (paVar1->value).parent.super_Schema.raw = (RawBrandedSchema *)_kjCondition._0_8_;
        *(uint **)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = _kjCondition.right;
        uVar7 = uVar10;
      }
      else {
        uVar12 = uVar8 + uVar10 >> 1;
        __n_00 = __n;
        if (__n >= uVar11) {
          __n_00 = uVar11;
        }
        iVar9 = memcmp(RVar15.super_StringPtr.content.ptr,name.content.ptr,__n_00);
        bVar4 = iVar9 < 0;
        if (iVar9 == 0) {
          bVar4 = __n < uVar11;
        }
        uVar7 = uVar12;
        if (bVar4) {
          uVar7 = uVar10;
          uVar8 = uVar12 + 1;
        }
      }
      uVar10 = uVar7;
    } while (!bVar14);
    if ((__return_storage_ptr__->ptr).isSet == false) {
      LStack_60.capTable = (CapTableReader *)((this->super_Schema).raw)->generic->encodedNode;
      f.exception = (Exception *)0x0;
      LStack_60.segment = (SegmentReader *)0x0;
      LStack_60.ptr._0_4_ = 0x7fffffff;
      capnp::_::PointerReader::getStruct
                ((StructReader *)&_kjCondition,(PointerReader *)&f,(word *)0x0);
      superclass._reader.data = (void *)0x0;
      superclass._reader.segment = (SegmentReader *)0x0;
      superclass._reader.capTable = (CapTableReader *)0x0;
      superclass._reader.pointers._0_4_ = 0x7fffffff;
      if (4 < (ushort)_kjCondition._36_2_) {
        superclass._reader.data = (void *)(_kjCondition.op.content.size_ + 0x20);
        superclass._reader.segment = (SegmentReader *)_kjCondition._0_8_;
        superclass._reader.capTable = (CapTableReader *)_kjCondition.right;
        superclass._reader.pointers._0_4_ = iStack_d0;
      }
      capnp::_::PointerReader::getList
                ((ListReader *)&f,(PointerReader *)&superclass,INLINE_COMPOSITE,(word *)0x0);
      uVar11 = (ulong)(uint)LStack_60.ptr;
      if (uVar11 != 0) {
        lVar13 = 0;
        do {
          capnp::_::ListReader::getStructElement
                    (&superclass._reader,(ListReader *)&f,(ElementCount)lVar13);
          if (superclass._reader.dataSize < 0x40) {
            id = 0;
          }
          else {
            id = *superclass._reader.data;
          }
          local_a8 = Schema::getDependency(&this->super_Schema,id,(ElementCount)lVar13 | 0x4000000);
          local_a0.raw = (RawBrandedSchema *)Schema::asInterface(&local_a8);
          findMethodByName((Maybe<capnp::InterfaceSchema::Method> *)&_kjCondition,
                           (InterfaceSchema *)&local_a0,name,counter);
          if ((StructReader *)&_kjCondition != (StructReader *)__return_storage_ptr__) {
            if ((__return_storage_ptr__->ptr).isSet == true) {
              (__return_storage_ptr__->ptr).isSet = false;
            }
            if ((char)_kjCondition.left == '\x01') {
              pNVar5 = &__return_storage_ptr__->ptr;
              *(undefined4 *)((long)&pNVar5->field_1 + 0x30) = uStack_c0;
              *(short *)((long)&pNVar5->field_1 + 0x34) = (short)uStack_bc;
              *(short *)((long)&pNVar5->field_1 + 0x36) = (short)((uint)uStack_bc >> 0x10);
              *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.proto._reader.nestingLimit
                   = uStack_b8;
              (__return_storage_ptr__->ptr).field_1.value.proto._reader.data =
                   (void *)CONCAT44(uStack_cc,iStack_d0);
              (__return_storage_ptr__->ptr).field_1.value.proto._reader.pointers =
                   (WirePointer *)CONCAT26(uStack_c2,CONCAT24(sStack_c4,local_c8));
              (__return_storage_ptr__->ptr).field_1.value.proto._reader.segment =
                   (SegmentReader *)_kjCondition.op.content.size_;
              (__return_storage_ptr__->ptr).field_1.value.proto._reader.capTable =
                   (CapTableReader *)
                   CONCAT26(_kjCondition._38_2_,CONCAT24(_kjCondition._36_2_,_kjCondition._32_4_));
              (paVar1->value).parent.super_Schema.raw = (RawBrandedSchema *)_kjCondition.right;
              *(char **)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
                   _kjCondition.op.content.ptr;
              (__return_storage_ptr__->ptr).isSet = true;
            }
          }
          if ((char)_kjCondition.left == '\x01') {
            _kjCondition._0_8_ = _kjCondition._0_8_ & 0xffffffffffffff00;
          }
        } while (((__return_storage_ptr__->ptr).isSet == false) &&
                (bVar14 = uVar11 - 1 != lVar13, lVar13 = lVar13 + 1, bVar14));
      }
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int_const&>&,char_const(&)[53]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x24a,FAILED,"counter++ < MAX_SUPERCLASSES",
               "_kjCondition,\"Cyclic or absurdly-large inheritance graph detected.\"",&_kjCondition
               ,(char (*) [53])"Cyclic or absurdly-large inheritance graph detected.");
    (__return_storage_ptr__->ptr).isSet = false;
    kj::_::Debug::Fault::~Fault(&f);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<InterfaceSchema::Method> InterfaceSchema::findMethodByName(
    kj::StringPtr name, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return kj::none;
  }

  auto result = findSchemaMemberByName(raw->generic, name, getMethods());

  if (result == kj::none) {
    // Search superclasses.
    // TODO(perf):  This may be somewhat slow, and in the case of lots of diamond dependencies it
    //   could get pathological.  Arguably we should generate a flat list of transitive
    //   superclasses to search and store it in the RawSchema.  It's problematic, though, because
    //   this means that a dynamically-loaded RawSchema cannot be correctly constructed until all
    //   superclasses have been loaded, which imposes an ordering requirement on SchemaLoader or
    //   requires updating subclasses whenever a new superclass is loaded.
    auto superclasses = getProto().getInterface().getSuperclasses();
    for (auto i: kj::indices(superclasses)) {
      auto superclass = superclasses[i];
      uint location = _::RawBrandedSchema::makeDepLocation(
          _::RawBrandedSchema::DepKind::SUPERCLASS, i);
      result = getDependency(superclass.getId(), location)
          .asInterface().findMethodByName(name, counter);
      if (result != kj::none) {
        break;
      }
    }
  }

  return result;
}